

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

string * __thiscall
kratos::FSMState::handle_name_abi_cxx11_(string *__return_storage_ptr__,FSMState *this)

{
  pointer pcVar1;
  FSM *pFVar2;
  FSM *pFVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  FSM *pFVar4;
  string_view format_str;
  format_args args;
  pointer local_78;
  size_type sStack_70;
  pointer local_68;
  size_type sStack_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name_)._M_string_length);
  pFVar2 = this->parent_->parent_fsm_;
  if (pFVar2 != (FSM *)0x0) {
    pFVar4 = this->parent_;
    do {
      pFVar3 = pFVar2;
      local_78 = (pFVar4->fsm_name_)._M_dataplus._M_p;
      sStack_70 = (pFVar4->fsm_name_)._M_string_length;
      local_68 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sStack_60 = __return_storage_ptr__->_M_string_length;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0x7;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_78;
      fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)"{0}_{1}",format_str,args);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pFVar2 = pFVar3->parent_fsm_;
      pFVar4 = pFVar3;
    } while (pFVar2 != (FSM *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FSMState::handle_name() const {
    auto str = name_;
    auto* current = parent_;
    auto* p = parent_->parent_fsm();
    while (p) {
        str = ::format("{0}_{1}", current->fsm_name(), str);
        current = p;
        p = p->parent_fsm();
    }
    return str;
}